

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O0

bool __thiscall
draco::MeshAttributeCornerTable::RecomputeVerticesInternal<false>
          (MeshAttributeCornerTable *this,Mesh *mesh,PointAttribute *att)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  CornerIndex act_c;
  CornerIndex first_c;
  AttributeValueIndex first_vert_id;
  CornerIndex c;
  VertexIndex v;
  int num_new_vertices;
  MeshAttributeCornerTable *in_stack_ffffffffffffff48;
  uint *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 uVar4;
  uint *in_stack_ffffffffffffff60;
  vector<bool,_std::allocator<bool>_> *__n;
  ThisIndexType local_80;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_7c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  ThisIndexType local_68;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_64;
  uint local_60;
  ThisIndexType local_5c;
  uint local_58;
  ThisIndexType local_54;
  reference local_50;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_40;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_3c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_38;
  uint local_34;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_30;
  uint local_2c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_28;
  uint local_24;
  
  std::
  vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ::clear((vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           *)0x191998);
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::clear((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           *)0x1919a6);
  local_24 = 0;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::IndexType(&local_28,0);
  do {
    local_2c = CornerTable::num_vertices((CornerTable *)0x1919d1);
    bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator<(&local_28,&local_2c);
    if (!bVar1) {
      return true;
    }
    local_34 = local_28.value_;
    local_30.value_ =
         (uint)CornerTable::LeftMostCorner
                         ((CornerTable *)in_stack_ffffffffffffff48,(uint)in_stack_ffffffffffffff50);
    bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                      (&local_30,
                       (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex
                      );
    uVar2 = local_24;
    if (!bVar1) {
      local_24 = local_24 + 1;
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_38,uVar2);
      std::
      vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ::push_back((vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                   *)in_stack_ffffffffffffff60,
                  (value_type *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      local_3c.value_ = local_30.value_;
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_40);
      __n = in_RDI + 1;
      IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_28);
      local_50 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDI,(size_type)__n);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_50);
      if (bVar1) {
        local_58 = local_3c.value_;
        local_54.value_ =
             (uint)SwingLeft((MeshAttributeCornerTable *)
                             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                             (uint)in_stack_ffffffffffffff60);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_40,&local_54);
        while (bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                                 (&local_40,
                                  (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                  &kInvalidCornerIndex), bVar1) {
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_3c,&local_40);
          local_60 = local_40.value_;
          local_5c.value_ =
               (uint)SwingLeft((MeshAttributeCornerTable *)
                               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                               (uint)in_stack_ffffffffffffff60);
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_40,&local_5c);
          bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                            (&local_40,&local_30);
          if (bVar1) {
            return false;
          }
        }
      }
      uVar2 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(&local_38);
      IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::IndexType(&local_64,uVar2);
      in_stack_ffffffffffffff60 =
           &in_RDI[2].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset;
      uVar2 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_3c);
      pvVar3 = std::
               vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
               ::operator[]((vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                             *)in_stack_ffffffffffffff60,(ulong)uVar2);
      IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(pvVar3,&local_64);
      std::
      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ::push_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   *)in_stack_ffffffffffffff60,
                  (value_type *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      local_6c = local_3c.value_;
      local_68.value_ =
           (uint)CornerTable::SwingRight
                           ((CornerTable *)
                            CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                            (uint)in_stack_ffffffffffffff60);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_40,&local_68);
      while( true ) {
        bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                          (&local_40,
                           (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                           &kInvalidCornerIndex);
        uVar4 = false;
        if (bVar1) {
          uVar4 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                            (&local_40,&local_3c);
        }
        if ((bool)uVar4 == false) break;
        local_74 = local_40.value_;
        local_70 = (uint)CornerTable::Next((CornerTable *)CONCAT17(uVar4,in_stack_ffffffffffffff58),
                                           (CornerIndex)(uint)in_stack_ffffffffffffff60);
        bVar1 = IsCornerOppositeToSeamEdge
                          (in_stack_ffffffffffffff48,
                           (CornerIndex)(uint)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        uVar2 = local_24;
        if (bVar1) {
          local_24 = local_24 + 1;
          IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_78,uVar2);
          IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator=
                    (&local_38,&local_78);
          std::
          vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
          ::push_back((vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                       *)in_stack_ffffffffffffff60,
                      (value_type *)CONCAT17(uVar4,in_stack_ffffffffffffff58));
          std::
          vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ::push_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       *)in_stack_ffffffffffffff60,
                      (value_type *)CONCAT17(uVar4,in_stack_ffffffffffffff58));
        }
        uVar2 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(&local_38);
        IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::IndexType(&local_7c,uVar2);
        in_stack_ffffffffffffff50 =
             &in_RDI[2].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_offset;
        uVar2 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_40);
        pvVar3 = std::
                 vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                 ::operator[]((vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                               *)in_stack_ffffffffffffff50,(ulong)uVar2);
        IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=(pvVar3,&local_7c);
        local_80.value_ =
             (uint)CornerTable::SwingRight
                             ((CornerTable *)CONCAT17(uVar4,in_stack_ffffffffffffff58),
                              (uint)in_stack_ffffffffffffff60);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_40,&local_80);
      }
      in_stack_ffffffffffffff5f = 0;
    }
    IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator++(&local_28);
  } while( true );
}

Assistant:

bool MeshAttributeCornerTable::RecomputeVerticesInternal(
    const Mesh *mesh, const PointAttribute *att) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  vertex_to_attribute_entry_id_map_.clear();
  vertex_to_left_most_corner_map_.clear();
  int num_new_vertices = 0;
  for (VertexIndex v(0); v < corner_table_->num_vertices(); ++v) {
    const CornerIndex c = corner_table_->LeftMostCorner(v);
    if (c == kInvalidCornerIndex) {
      continue;  // Isolated vertex?
    }
    AttributeValueIndex first_vert_id(num_new_vertices++);
    if (init_vertex_to_attribute_entry_map) {
      const PointIndex point_id = mesh->CornerToPointId(c.value());
      vertex_to_attribute_entry_id_map_.push_back(att->mapped_index(point_id));
    } else {
      // Identity mapping
      vertex_to_attribute_entry_id_map_.push_back(first_vert_id);
    }
    CornerIndex first_c = c;
    CornerIndex act_c;
    // Check if the vertex is on a seam edge, if it is we need to find the first
    // attribute entry on the seam edge when traversing in the CCW direction.
    if (is_vertex_on_seam_[v.value()]) {
      // Try to swing left on the modified corner table. We need to get the
      // first corner that defines an attribute seam.
      act_c = SwingLeft(first_c);
      while (act_c != kInvalidCornerIndex) {
        first_c = act_c;
        act_c = SwingLeft(act_c);
        if (act_c == c) {
          // We reached the initial corner which shouldn't happen when we swing
          // left from |c|.
          return false;
        }
      }
    }
    corner_to_vertex_map_[first_c.value()] = VertexIndex(first_vert_id.value());
    vertex_to_left_most_corner_map_.push_back(first_c);
    act_c = corner_table_->SwingRight(first_c);
    while (act_c != kInvalidCornerIndex && act_c != first_c) {
      if (IsCornerOppositeToSeamEdge(corner_table_->Next(act_c))) {
        first_vert_id = AttributeValueIndex(num_new_vertices++);
        if (init_vertex_to_attribute_entry_map) {
          const PointIndex point_id = mesh->CornerToPointId(act_c.value());
          vertex_to_attribute_entry_id_map_.push_back(
              att->mapped_index(point_id));
        } else {
          // Identity mapping.
          vertex_to_attribute_entry_id_map_.push_back(first_vert_id);
        }
        vertex_to_left_most_corner_map_.push_back(act_c);
      }
      corner_to_vertex_map_[act_c.value()] = VertexIndex(first_vert_id.value());
      act_c = corner_table_->SwingRight(act_c);
    }
  }
  return true;
}